

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_rar.c
# Opt level: O2

void test_read_format_rar_windows(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive_conflict *a;
  char *pcVar4;
  time_t tVar5;
  la_int64_t lVar6;
  la_ssize_t lVar7;
  char test_txt [17];
  archive_entry *ae;
  char reffile [33];
  char buff [441];
  
  builtin_strncpy(reffile + 0x10,"_rar_windows.rar",0x11);
  builtin_strncpy(reffile,"test_read_format",0x10);
  builtin_strncpy(test_txt,"test text file\r\n",0x11);
  extract_reference_file(reffile);
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'̲',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'̳',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'̴',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",a);
  wVar2 = archive_read_open_filename(a,reffile,0x2800);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'̵',(uint)(wVar2 == L'\0'),
                   "0 == archive_read_open_filename(a, reffile, 10240)",a);
  iVar1 = archive_read_next_header((archive *)a,&ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'̸',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'̹',"testdir/test.txt","\"testdir/test.txt\"",pcVar4,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'̺',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a);
  tVar5 = archive_entry_ctime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'̻',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",a);
  tVar5 = archive_entry_atime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'̼',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",a);
  lVar6 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'̽',0x10,"16",lVar6,"archive_entry_size(ae)",(void *)0x0);
  mVar3 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'̾',0x81a4,"33188",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'̿',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'̀',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
  lVar7 = archive_read_data((archive *)a,buff,0x10);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'́',(uint)(lVar7 == 0x10),"size == archive_read_data(a, buff, size)",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'͂',buff,"buff",test_txt,"test_txt",0x10,"size",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)a,&ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ͅ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'͆',"test.txt","\"test.txt\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0')
  ;
  tVar5 = archive_entry_mtime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'͇',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a);
  tVar5 = archive_entry_ctime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'͈',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",a);
  tVar5 = archive_entry_atime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'͉',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",a);
  lVar6 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'͊',0x10,"16",lVar6,"archive_entry_size(ae)",(void *)0x0);
  mVar3 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'͋',0x81a4,"33188",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'͌',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'͍',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
  lVar7 = archive_read_data((archive *)a,buff,0x10);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'͎',(uint)(lVar7 == 0x10),"size == archive_read_data(a, buff, size)",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'͏',buff,"buff",test_txt,"test_txt",0x10,"size",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)a,&ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'͒',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'͓',"testshortcut.lnk","\"testshortcut.lnk\"",pcVar4,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'͔',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a);
  tVar5 = archive_entry_ctime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'͕',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",a);
  tVar5 = archive_entry_atime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'͖',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",a);
  lVar6 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'͗',0x1b9,"sizeof(buff)",lVar6,"archive_entry_size(ae)",(void *)0x0);
  mVar3 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'͘',0x81a4,"33188",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'͙',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'͚',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
  lVar7 = archive_read_data((archive *)a,buff,0x1b9);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'͛',(uint)(lVar7 == 0x1b9),
                   "sizeof(buff) == archive_read_data(a, buff, sizeof(buff))",a);
  iVar1 = archive_read_next_header((archive *)a,&ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'͞',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'͟',"testdir","\"testdir\"",pcVar4,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'͠',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a);
  tVar5 = archive_entry_ctime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'͡',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",a);
  tVar5 = archive_entry_atime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'͢',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",a);
  lVar6 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ͣ',0,"0",lVar6,"archive_entry_size(ae)",(void *)0x0);
  mVar3 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ͤ',0x41ed,"16877",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ͥ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ͦ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
  iVar1 = archive_read_next_header((archive *)a,&ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ͩ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'ͪ',"testemptydir","\"testemptydir\"",pcVar4,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ͫ',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a);
  tVar5 = archive_entry_ctime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ͬ',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",a);
  tVar5 = archive_entry_atime(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ͭ',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",a);
  lVar6 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ͮ',0,"0",lVar6,"archive_entry_size(ae)",(void *)0x0);
  mVar3 = archive_entry_mode(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ͯ',0x41ed,"16877",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'Ͱ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ͱ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
  iVar1 = archive_read_next_header((archive *)a,&ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ʹ',(uint)(iVar1 == 1),"1 == archive_read_next_header(a, &ae)",a);
  iVar1 = archive_file_count((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'͵',5,"5",(long)iVar1,"archive_file_count(a)",(void *)0x0);
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'Ͷ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ͷ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_rar_windows)
{
  char buff[441];
  const char reffile[] = "test_read_format_rar_windows.rar";
  const char test_txt[] = "test text file\r\n";
  int size = sizeof(test_txt)-1;
  struct archive_entry *ae;
  struct archive *a;

  extract_reference_file(reffile);
  assert((a = archive_read_new()) != NULL);
  assertA(0 == archive_read_support_filter_all(a));
  assertA(0 == archive_read_support_format_all(a));
  assertA(0 == archive_read_open_filename(a, reffile, 10240));

  /* First header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testdir/test.txt", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(16, archive_entry_size(ae));
  assertEqualInt(33188, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
  assertA(size == archive_read_data(a, buff, size));
  assertEqualMem(buff, test_txt, size);

  /* Second header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("test.txt", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(16, archive_entry_size(ae));
  assertEqualInt(33188, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
  assertA(size == archive_read_data(a, buff, size));
  assertEqualMem(buff, test_txt, size);

  /* Third header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testshortcut.lnk", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(sizeof(buff), archive_entry_size(ae));
  assertEqualInt(33188, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);
  assertA(sizeof(buff) == archive_read_data(a, buff, sizeof(buff)));

  /* Fourth header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testdir", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(0, archive_entry_size(ae));
  assertEqualInt(16877, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

  /* Fifth header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("testemptydir", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(0, archive_entry_size(ae));
  assertEqualInt(16877, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

  /* Test EOF */
  assertA(1 == archive_read_next_header(a, &ae));
  assertEqualInt(5, archive_file_count(a));
  assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
  assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}